

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

handle pybind11::detail::find_registered_python_instance(void *src,type_info *tinfo)

{
  handle hVar1;
  void *in_RDI;
  type_info *local_20;
  void *local_18;
  anon_class_16_2_d9718367 local_10;
  
  local_10.src = &local_18;
  local_10.tinfo = &local_20;
  hVar1 = with_instance_map<pybind11::detail::find_registered_python_instance(void*,pybind11::detail::type_info_const*)::_lambda(std::unordered_multimap<void_const*,pybind11::detail::instance*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>>&)_1_>
                    (in_RDI,&local_10);
  return (handle)hVar1.m_ptr;
}

Assistant:

PYBIND11_NOINLINE handle find_registered_python_instance(void *src,
                                                         const detail::type_info *tinfo) {
    return with_instance_map(src, [&](instance_map &instances) {
        auto it_instances = instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto *instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype)) {
                    return handle((PyObject *) it_i->second).inc_ref();
                }
            }
        }
        return handle();
    });
}